

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t archive_read_format_cab_bid(archive_read *a,wchar_t best_bid)

{
  wchar_t wVar1;
  long in_RAX;
  long *plVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  char *p;
  long lVar6;
  ssize_t bytes_avail;
  long local_38;
  
  wVar1 = L'\xffffffff';
  if ((best_bid < L'A') &&
     (local_38 = in_RAX, plVar2 = (long *)__archive_read_ahead(a,8,(ssize_t *)0x0),
     plVar2 != (long *)0x0)) {
    if (*plVar2 == 0x4643534d) {
LAB_003c3eed:
      wVar1 = L'@';
    }
    else {
      wVar1 = L'\0';
      if (((char)*plVar2 == 'M') && (wVar1 = L'\0', *(char *)((long)plVar2 + 1) == 'Z')) {
        uVar5 = 0x1000;
        lVar6 = 0;
        do {
          pvVar3 = __archive_read_ahead(a,lVar6 + uVar5,&local_38);
          if (pvVar3 == (void *)0x0) {
            uVar5 = (long)uVar5 >> 1;
            if (uVar5 < 0x80) {
              return L'\0';
            }
          }
          else {
            p = (char *)(lVar6 + (long)pvVar3);
            pcVar4 = (char *)(local_38 + (long)pvVar3);
            while (p + 8 < pcVar4) {
              wVar1 = find_cab_magic(p);
              p = p + (uint)wVar1;
              if (wVar1 == L'\0') goto LAB_003c3eed;
            }
            lVar6 = (long)p - (long)pvVar3;
          }
          wVar1 = L'\0';
        } while (lVar6 < 0x20000);
      }
    }
  }
  return wVar1;
}

Assistant:

static int
archive_read_format_cab_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	ssize_t bytes_avail, offset, window;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 64)
		return (-1);

	if ((p = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);

	if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
		return (64);

	/*
	 * Attempt to handle self-extracting archives
	 * by noting a PE header and searching forward
	 * up to 128k for a 'MSCF' marker.
	 */
	if (p[0] == 'M' && p[1] == 'Z') {
		offset = 0;
		window = 4096;
		while (offset < (1024 * 128)) {
			const char *h = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (h == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 128)
					return (0);
				continue;
			}
			p = h + offset;
			while (p + 8 < h + bytes_avail) {
				int next;
				if ((next = find_cab_magic(p)) == 0)
					return (64);
				p += next;
			}
			offset = p - h;
		}
	}
	return (0);
}